

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlBufGetChildContent(xmlBufPtr buf,xmlNode *tree)

{
  _xmlNode *p_Var1;
  _xmlNode *ref;
  
  p_Var1 = tree->children;
  if (tree->children == (xmlNode *)0x0) {
    return;
  }
  while (ref = p_Var1, 1 < ref->type - XML_TEXT_NODE) {
    if (ref->type == XML_ENTITY_REF_NODE) {
      xmlBufGetEntityRefContent(buf,ref);
      goto LAB_00150484;
    }
    p_Var1 = ref->children;
    if (ref->children == (_xmlNode *)0x0) {
LAB_00150484:
      while (p_Var1 = ref->next, ref->next == (_xmlNode *)0x0) {
        ref = ref->parent;
        if (ref == tree) {
          return;
        }
      }
    }
  }
  xmlBufCat(buf,ref->content);
  goto LAB_00150484;
}

Assistant:

static void
xmlBufGetChildContent(xmlBufPtr buf, const xmlNode *tree) {
    const xmlNode *cur = tree->children;

    while (cur != NULL) {
        switch (cur->type) {
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
                xmlBufCat(buf, cur->content);
                break;

            case XML_ENTITY_REF_NODE:
                xmlBufGetEntityRefContent(buf, cur);
                break;

            default:
                if (cur->children != NULL) {
                    cur = cur->children;
                    continue;
                }
                break;
        }

        while (cur->next == NULL) {
            cur = cur->parent;
            if (cur == tree)
                return;
        }
        cur = cur->next;
    }
}